

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::parseBitwiseAnd(StructuralParser *this)

{
  bool bVar1;
  Expression *a;
  Expression *b;
  Context context;
  
  a = parseEqualityOperator(this);
  while( true ) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x29af2e);
    if (!bVar1) break;
    getContext(&context,this);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    b = parseEqualityOperator(this);
    a = createBinaryOperator(this,&context,a,b,bitwiseAnd);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&context);
  }
  return a;
}

Assistant:

AST::Expression& parseBitwiseAnd()
    {
        for (pool_ref<AST::Expression> a = parseEqualityOperator();;)
        {
            if (! matches (Operator::bitwiseAnd))
                return a;

            auto context = getContext();
            skip();
            a = createBinaryOperator (context, a, parseEqualityOperator(), BinaryOp::Op::bitwiseAnd);
        }
    }